

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void BrotliBuildAndStoreHuffmanTreeFast
               (MemoryManager *m,uint32_t *histogram,size_t histogram_total,size_t max_bits,
               uint8_t *depth,uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  size_t __n;
  uint uVar1;
  uint uVar2;
  HuffmanTree HVar3;
  byte bVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  size_t sVar9;
  HuffmanTree *pool;
  HuffmanTree *pHVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  byte bVar23;
  byte bVar24;
  long lVar25;
  size_t symbols [4];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  size_t local_50;
  MemoryManager *local_48;
  uint16_t *local_40;
  ulong local_38;
  
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_78._0_8_ = 0;
  if (histogram_total != 0) {
    local_38 = 0;
    __n = 0;
    do {
      sVar9 = __n;
      uVar22 = histogram[sVar9];
      if ((ulong)uVar22 != 0) {
        if (local_38 < 4) {
          *(size_t *)(local_78 + local_38 * 8) = sVar9;
        }
        local_38 = local_38 + 1;
        histogram_total = histogram_total - uVar22;
      }
      __n = sVar9 + 1;
    } while (histogram_total != 0);
    if (1 < local_38) {
      local_50 = max_bits;
      local_40 = bits;
      memset(depth,0,__n);
      local_48 = m;
      pool = (HuffmanTree *)BrotliAllocate(m,__n * 0x10 | 8);
      uVar22 = 1;
      pHVar10 = pool;
      sVar7 = sVar9;
      sVar6 = __n;
      do {
        while (sVar5 = sVar7, sVar6 != 0) {
          uVar13 = histogram[sVar5];
          if (uVar13 != 0) {
            if (uVar13 < uVar22) {
              uVar13 = uVar22;
            }
            pHVar10->total_count_ = uVar13;
            pHVar10->index_left_ = -1;
            pHVar10->index_right_or_value_ = (int16_t)sVar5;
            pHVar10 = pHVar10 + 1;
          }
          sVar7 = sVar5 - 1;
          sVar6 = sVar5;
        }
        iVar8 = (int)((ulong)((long)pHVar10 - (long)pool) >> 3);
        uVar12 = (ulong)iVar8;
        if (uVar12 < 0xd) {
          if (1 < uVar12) {
            uVar14 = 1;
            do {
              HVar3 = pool[uVar14];
              uVar18 = uVar14;
              do {
                if (pool[uVar18 - 1].total_count_ <= HVar3.total_count_) goto LAB_0011b3ba;
                pool[uVar18] = pool[uVar18 - 1];
                uVar18 = uVar18 - 1;
              } while (uVar18 != 0);
              uVar18 = 0;
LAB_0011b3ba:
              pool[uVar18] = HVar3;
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar12);
          }
        }
        else {
          uVar14 = (ulong)((uint)(uVar12 < 0x39) * 2);
          do {
            uVar18 = *(ulong *)(SortHuffmanTreeItems_gaps + uVar14 * 8);
            if (uVar18 < uVar12) {
              lVar25 = 0;
              uVar16 = uVar18;
              do {
                HVar3 = pool[uVar16];
                uVar20 = uVar16;
                for (lVar19 = lVar25;
                    (uVar18 <= uVar20 &&
                    (HVar3.total_count_ < *(uint *)((long)&pool->total_count_ + lVar19)));
                    lVar19 = lVar19 + uVar18 * -8) {
                  pool[uVar20] = *(HuffmanTree *)((long)&pool->total_count_ + lVar19);
                  uVar20 = uVar20 - uVar18;
                }
                pool[uVar20] = HVar3;
                uVar16 = uVar16 + 1;
                lVar25 = lVar25 + 8;
              } while (uVar16 != uVar12);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != 6);
        }
        pHVar10->total_count_ = 0xffffffff;
        pHVar10->index_left_ = -1;
        pHVar10->index_right_or_value_ = -1;
        pHVar10[1].total_count_ = 0xffffffff;
        pHVar10[1].index_left_ = -1;
        pHVar10[1].index_right_or_value_ = -1;
        if (1 < iVar8) {
          iVar11 = iVar8 + 1;
          pHVar10 = pHVar10 + 2;
          uVar13 = iVar8 + 1;
          iVar15 = 0;
          do {
            uVar2 = pool[iVar15].total_count_;
            uVar1 = pool[iVar11].total_count_;
            iVar17 = iVar15;
            if (uVar1 < uVar2) {
              iVar17 = iVar11;
            }
            iVar15 = iVar15 + (uint)(uVar2 <= uVar1);
            iVar11 = iVar11 + (uint)(uVar1 < uVar2);
            uVar2 = pool[iVar15].total_count_;
            uVar1 = pool[iVar11].total_count_;
            iVar21 = iVar15;
            if (uVar1 < uVar2) {
              iVar21 = iVar11;
            }
            iVar15 = iVar15 + (uint)(uVar2 <= uVar1);
            iVar11 = iVar11 + (uint)(uVar1 < uVar2);
            pHVar10[-1].total_count_ = pool[iVar21].total_count_ + pool[iVar17].total_count_;
            pHVar10[-1].index_left_ = (int16_t)iVar17;
            pHVar10[-1].index_right_or_value_ = (int16_t)iVar21;
            pHVar10->total_count_ = 0xffffffff;
            pHVar10->index_left_ = -1;
            pHVar10->index_right_or_value_ = -1;
            pHVar10 = pHVar10 + 1;
            uVar13 = uVar13 - 1;
          } while (2 < uVar13);
        }
        iVar8 = BrotliSetDepth(iVar8 * 2 + -1,pool,depth,0xe);
        uVar22 = uVar22 * 2;
        pHVar10 = pool;
        sVar7 = sVar9;
        sVar6 = __n;
      } while (iVar8 == 0);
      BrotliFree(local_48,pool);
      BrotliConvertBitDepthsToSymbols(depth,__n,local_40);
      if (local_38 < 5) {
        uVar14 = *storage_ix;
        *(ulong *)(storage + (uVar14 >> 3)) = (ulong)storage[uVar14 >> 3] | 1L << ((byte)uVar14 & 7)
        ;
        uVar12 = uVar14 + 2;
        *storage_ix = uVar12;
        *(ulong *)(storage + (uVar12 >> 3)) =
             local_38 - 1 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        uVar14 = uVar14 + 4;
        *storage_ix = uVar14;
        uVar12 = 0;
        do {
          uVar18 = uVar12 + 1;
          if (uVar18 < local_38) {
            lVar25 = *(long *)(local_78 + uVar12 * 8);
            uVar16 = uVar18;
            do {
              lVar19 = *(long *)(local_78 + uVar16 * 8);
              if (depth[lVar19] < depth[lVar25]) {
                *(long *)(local_78 + uVar16 * 8) = lVar25;
                *(long *)(local_78 + uVar12 * 8) = lVar19;
                lVar25 = lVar19;
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 < local_38);
          }
          uVar12 = uVar18;
        } while (uVar18 != local_38);
        uVar20 = local_78._0_8_ << ((byte)uVar14 & 7);
        uVar16 = uVar14 >> 3;
        uVar14 = uVar14 + local_50;
        uVar18 = uVar14 >> 3;
        bVar23 = (byte)uVar14;
        uVar12 = uVar14 + local_50;
        if (local_38 != 3) {
          if (local_38 == 2) {
            *(ulong *)(storage + uVar16) = uVar20 | storage[uVar16];
            *storage_ix = uVar14;
            *(ulong *)(storage + uVar18) = local_78._8_8_ << (bVar23 & 7) | (ulong)storage[uVar18];
            *storage_ix = uVar12;
            return;
          }
          *(ulong *)(storage + uVar16) = uVar20 | storage[uVar16];
          *storage_ix = uVar14;
          *(ulong *)(storage + uVar18) = local_78._8_8_ << (bVar23 & 7) | (ulong)storage[uVar18];
          *storage_ix = uVar12;
          *(ulong *)(storage + (uVar12 >> 3)) =
               local_68._0_8_ << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          uVar12 = uVar12 + local_50;
          *storage_ix = uVar12;
          *(ulong *)(storage + (uVar12 >> 3)) =
               local_68._8_8_ << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          uVar14 = uVar12 + local_50;
          *storage_ix = uVar14;
          *(ulong *)(storage + (uVar14 >> 3)) =
               (ulong)(depth[local_78._0_8_] == '\x01') << ((byte)uVar14 & 7) |
               (ulong)storage[uVar14 >> 3];
          *storage_ix = uVar12 + local_50 + 1;
          return;
        }
        *(ulong *)(storage + uVar16) = uVar20 | storage[uVar16];
        *storage_ix = uVar14;
        *(ulong *)(storage + uVar18) = local_78._8_8_ << (bVar23 & 7) | (ulong)storage[uVar18];
        *storage_ix = uVar12;
        *(ulong *)(storage + (uVar12 >> 3)) =
             local_68._0_8_ << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        *storage_ix = local_50 + uVar12;
        return;
      }
      uVar12 = *storage_ix;
      uVar14 = uVar12 + 0x28;
      *(ulong *)(storage + (uVar12 >> 3)) =
           0xff55555554 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
      *storage_ix = uVar14;
      if (__n == 0) {
        return;
      }
      uVar12 = 0;
      bVar23 = 8;
      do {
        bVar24 = depth[uVar12];
        uVar16 = 1;
        uVar18 = uVar12 + 1;
        if (uVar12 + 1 < __n) {
          uVar18 = uVar16;
          do {
            uVar16 = uVar18;
            if (depth[uVar18 + uVar12] != bVar24) break;
            lVar25 = (uVar12 - sVar9) + uVar18;
            uVar18 = uVar18 + 1;
            uVar16 = __n - uVar12;
          } while (lVar25 != 0);
          uVar18 = uVar12 + uVar16;
        }
        uVar12 = uVar18;
        if (bVar24 == 0) {
          uVar22 = kZeroRepsDepth[uVar16];
          *(uint64_t *)(storage + (uVar14 >> 3)) =
               kZeroRepsBits[uVar16] << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
          uVar14 = uVar14 + uVar22;
          bVar24 = bVar23;
LAB_0011b81d:
          *storage_ix = uVar14;
        }
        else {
          if (bVar23 != bVar24) {
            bVar23 = "\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x05\x05"[bVar24];
            *(ulong *)(storage + (uVar14 >> 3)) =
                 (ulong)kCodeLengthBits[bVar24] << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
            uVar14 = uVar14 + bVar23;
            *storage_ix = uVar14;
            uVar16 = uVar16 - 1;
          }
          if (2 < uVar16) {
            uVar22 = kCodeLengthBits[uVar16 + 0x11];
            *(ulong *)(storage + (uVar14 >> 3)) =
                 *(long *)(kNonZeroRepsDepth + uVar16 * 2 + 0x2ba) << ((byte)uVar14 & 7) |
                 (ulong)storage[uVar14 >> 3];
            uVar14 = uVar14 + uVar22;
            goto LAB_0011b81d;
          }
          if (uVar16 != 0) {
            bVar23 = "\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x05\x05"[bVar24];
            uVar22 = kCodeLengthBits[bVar24];
            do {
              uVar18 = uVar14 >> 3;
              bVar4 = (byte)uVar14;
              uVar14 = uVar14 + bVar23;
              *(ulong *)(storage + uVar18) = (ulong)uVar22 << (bVar4 & 7) | (ulong)storage[uVar18];
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
            goto LAB_0011b81d;
          }
        }
        bVar23 = bVar24;
        if (__n <= uVar12) {
          return;
        }
      } while( true );
    }
  }
  uVar14 = *storage_ix;
  uVar12 = uVar14 + 4;
  *(ulong *)(storage + (uVar14 >> 3)) = (ulong)storage[uVar14 >> 3] | 1L << ((byte)uVar14 & 7);
  *storage_ix = uVar12;
  *(ulong *)(storage + (uVar12 >> 3)) =
       local_78._0_8_ << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
  *storage_ix = uVar14 + max_bits + 4;
  depth[local_78._0_8_] = '\0';
  bits[local_78._0_8_] = 0;
  return;
}

Assistant:

void BrotliBuildAndStoreHuffmanTreeFast(MemoryManager* m,
                                        const uint32_t* histogram,
                                        const size_t histogram_total,
                                        const size_t max_bits,
                                        uint8_t* depth, uint16_t* bits,
                                        size_t* storage_ix,
                                        uint8_t* storage) {
  size_t count = 0;
  size_t symbols[4] = { 0 };
  size_t length = 0;
  size_t total = histogram_total;
  while (total != 0) {
    if (histogram[length]) {
      if (count < 4) {
        symbols[count] = length;
      }
      ++count;
      total -= histogram[length];
    }
    ++length;
  }

  if (count <= 1) {
    BrotliWriteBits(4, 1, storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
    depth[symbols[0]] = 0;
    bits[symbols[0]] = 0;
    return;
  }

  memset(depth, 0, length * sizeof(depth[0]));
  {
    const size_t max_tree_size = 2 * length + 1;
    HuffmanTree* tree = BROTLI_ALLOC(m, HuffmanTree, max_tree_size);
    uint32_t count_limit;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(tree)) return;
    for (count_limit = 1; ; count_limit *= 2) {
      HuffmanTree* node = tree;
      size_t l;
      for (l = length; l != 0;) {
        --l;
        if (histogram[l]) {
          if (BROTLI_PREDICT_TRUE(histogram[l] >= count_limit)) {
            InitHuffmanTree(node, histogram[l], -1, (int16_t)l);
          } else {
            InitHuffmanTree(node, count_limit, -1, (int16_t)l);
          }
          ++node;
        }
      }
      {
        const int n = (int)(node - tree);
        HuffmanTree sentinel;
        int i = 0;      /* Points to the next leaf node. */
        int j = n + 1;  /* Points to the next non-leaf node. */
        int k;

        SortHuffmanTreeItems(tree, (size_t)n, SortHuffmanTree);
        /* The nodes are:
           [0, n): the sorted leaf nodes that we start with.
           [n]: we add a sentinel here.
           [n + 1, 2n): new parent nodes are added here, starting from
                        (n+1). These are naturally in ascending order.
           [2n]: we add a sentinel at the end as well.
           There will be (2n+1) elements at the end. */
        InitHuffmanTree(&sentinel, BROTLI_UINT32_MAX, -1, -1);
        *node++ = sentinel;
        *node++ = sentinel;

        for (k = n - 1; k > 0; --k) {
          int left, right;
          if (tree[i].total_count_ <= tree[j].total_count_) {
            left = i;
            ++i;
          } else {
            left = j;
            ++j;
          }
          if (tree[i].total_count_ <= tree[j].total_count_) {
            right = i;
            ++i;
          } else {
            right = j;
            ++j;
          }
          /* The sentinel node becomes the parent node. */
          node[-1].total_count_ =
              tree[left].total_count_ + tree[right].total_count_;
          node[-1].index_left_ = (int16_t)left;
          node[-1].index_right_or_value_ = (int16_t)right;
          /* Add back the last sentinel node. */
          *node++ = sentinel;
        }
        if (BrotliSetDepth(2 * n - 1, tree, depth, 14)) {
          /* We need to pack the Huffman tree in 14 bits. If this was not
             successful, add fake entities to the lowest values and retry. */
          break;
        }
      }
    }
    BROTLI_FREE(m, tree);
  }
  BrotliConvertBitDepthsToSymbols(depth, length, bits);
  if (count <= 4) {
    size_t i;
    /* value of 1 indicates a simple Huffman code */
    BrotliWriteBits(2, 1, storage_ix, storage);
    BrotliWriteBits(2, count - 1, storage_ix, storage);  /* NSYM - 1 */

    /* Sort */
    for (i = 0; i < count; i++) {
      size_t j;
      for (j = i + 1; j < count; j++) {
        if (depth[symbols[j]] < depth[symbols[i]]) {
          BROTLI_SWAP(size_t, symbols, j, i);
        }
      }
    }

    if (count == 2) {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
    } else if (count == 3) {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
    } else {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[3], storage_ix, storage);
      /* tree-select */
      BrotliWriteBits(1, depth[symbols[0]] == 1 ? 1 : 0, storage_ix, storage);
    }
  } else {
    uint8_t previous_value = 8;
    size_t i;
    /* Complex Huffman Tree */
    StoreStaticCodeLengthCode(storage_ix, storage);

    /* Actual RLE coding. */
    for (i = 0; i < length;) {
      const uint8_t value = depth[i];
      size_t reps = 1;
      size_t k;
      for (k = i + 1; k < length && depth[k] == value; ++k) {
        ++reps;
      }
      i += reps;
      if (value == 0) {
        BrotliWriteBits(kZeroRepsDepth[reps], kZeroRepsBits[reps],
                        storage_ix, storage);
      } else {
        if (previous_value != value) {
          BrotliWriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                          storage_ix, storage);
          --reps;
        }
        if (reps < 3) {
          while (reps != 0) {
            reps--;
            BrotliWriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                            storage_ix, storage);
          }
        } else {
          reps -= 3;
          BrotliWriteBits(kNonZeroRepsDepth[reps], kNonZeroRepsBits[reps],
                          storage_ix, storage);
        }
        previous_value = value;
      }
    }
  }
}